

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TPublicType::initQualifiers(TPublicType *this,bool global)

{
  bool global_local;
  TPublicType *this_local;
  
  TQualifier::clear(&this->qualifier);
  if (global) {
    *(ulong *)&(this->qualifier).field_0x8 =
         *(ulong *)&(this->qualifier).field_0x8 & 0xffffffffffffff80 | 1;
  }
  return;
}

Assistant:

void initQualifiers(bool global = false)
    {
        qualifier.clear();
        if (global)
            qualifier.storage = EvqGlobal;
    }